

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O1

void __thiscall Range::each(Range *this,function<void_(const_CylHead_&)> *func,bool cyls_first)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  ushort uVar4;
  byte bVar5;
  undefined7 in_register_00000011;
  int head;
  int head_;
  uint *puVar6;
  CylHead *pCVar7;
  uint uVar8;
  uint head__00;
  uint *puVar9;
  string sStack_80;
  function<void_(const_CylHead_&)> *pfStack_60;
  uint *puStack_58;
  CylHead local_30;
  
  if (((int)CONCAT71(in_register_00000011,cyls_first) == 0) ||
     (head_ = this->head_begin, this->head_end - head_ < 2)) {
    uVar8 = this->cyl_begin;
    if ((int)uVar8 < this->cyl_end) {
      do {
        for (head__00 = this->head_begin; puVar9 = (uint *)(ulong)head__00,
            (int)head__00 < this->head_end; head__00 = head__00 + 1) {
          puVar6 = (uint *)(ulong)uVar8;
          pCVar7 = &local_30;
          CylHead::CylHead(&local_30,uVar8,head__00);
          if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00165a56;
          (*func->_M_invoker)((_Any_data *)func,&local_30);
        }
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 < this->cyl_end);
    }
  }
  else if (head_ < this->head_end) {
    do {
      for (uVar8 = this->cyl_begin; puVar9 = (uint *)(ulong)uVar8, (int)uVar8 < this->cyl_end;
          uVar8 = uVar8 + 1) {
        puVar6 = puVar9;
        pCVar7 = &local_30;
        CylHead::CylHead(&local_30,uVar8,head_);
        if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00165a56:
          std::__throw_bad_function_call();
          puVar6[1] = 4;
          if (pCVar7[0x1d].cyl == 0x534f4442) {
            uVar8 = 2;
          }
          else {
            uVar8 = (uint)((byte)(*(char *)((long)&pCVar7[0x1a].cyl + 2) - 1U) < 0xfe);
          }
          *puVar6 = uVar8;
          pfStack_60 = func;
          puStack_58 = puVar9;
          if (uVar8 == 2) {
            if (*(char *)((long)&pCVar7[0x1a].cyl + 2) == '\0') {
              return;
            }
            paVar2 = &sStack_80.field_2;
            sStack_80.field_2._M_allocated_capacity = *(size_type *)((long)&pCVar7[0x1a].cyl + 2);
            sStack_80.field_2._8_2_ = *(undefined2 *)((long)&pCVar7[0x1b].cyl + 2);
            sStack_80._M_string_length = 10;
            sStack_80.field_2._M_local_buf[10] = '\0';
            psVar1 = (string *)(puVar6 + 2);
            sStack_80._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::operator=((string *)psVar1,(string *)&sStack_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_80._M_dataplus._M_p != paVar2) {
              operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1
                             );
            }
            sStack_80._M_string_length = 6;
            sStack_80.field_2._M_local_buf[6] = 0;
            sStack_80.field_2._M_allocated_capacity._0_6_ = *(uint6 *)((long)&pCVar7[0x1f].cyl + 2);
            sStack_80._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_append((char *)psVar1,(ulong)paVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_80._M_dataplus._M_p != paVar2) {
              operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1
                             );
            }
            util::trim(&sStack_80,psVar1);
            std::__cxx11::string::operator=((string *)psVar1,(string *)&sStack_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_80._M_dataplus._M_p == paVar2) {
              return;
            }
          }
          else {
            if (uVar8 != 1) {
              return;
            }
            bVar3 = *(byte *)((long)&pCVar7[0x1f].head + 3);
            bVar5 = 0x23;
            if (bVar3 < 0x23) {
              bVar5 = bVar3;
            }
            puVar6[1] = (uint)(byte)(bVar5 + 4);
            uVar4 = (ushort)pCVar7[0x1f].head;
            puVar6[10] = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
            if (*(char *)((long)&pCVar7[0x1a].cyl + 2) == '*') {
              return;
            }
            paVar2 = &sStack_80.field_2;
            sStack_80.field_2._M_allocated_capacity = *(size_type *)((long)&pCVar7[0x1a].cyl + 2);
            sStack_80.field_2._8_2_ = *(undefined2 *)((long)&pCVar7[0x1b].cyl + 2);
            sStack_80._M_string_length = 10;
            sStack_80.field_2._M_local_buf[10] = '\0';
            psVar1 = (string *)(puVar6 + 2);
            sStack_80._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::operator=((string *)psVar1,(string *)&sStack_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_80._M_dataplus._M_p != paVar2) {
              operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1
                             );
            }
            util::trim(&sStack_80,psVar1);
            std::__cxx11::string::operator=((string *)psVar1,(string *)&sStack_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_80._M_dataplus._M_p == paVar2) {
              return;
            }
          }
          operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1);
          return;
        }
        (*func->_M_invoker)((_Any_data *)func,&local_30);
      }
      head_ = head_ + 1;
    } while (head_ < this->head_end);
  }
  return;
}

Assistant:

void Range::each(const std::function<void(const CylHead & cylhead)>& func, bool cyls_first/*=false*/) const
{
    if (cyls_first && heads() > 1)
    {
        for (auto head = head_begin; head < head_end; ++head)
            for (auto cyl = cyl_begin; cyl < cyl_end; ++cyl)
                func(CylHead(cyl, head));
    }
    else
    {
        for (auto cyl = cyl_begin; cyl < cyl_end; ++cyl)
            for (auto head = head_begin; head < head_end; ++head)
                func(CylHead(cyl, head));
    }
}